

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall
JetHead::ServerSocket::bind(ServerSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  sockaddr *__addr_00;
  char *pcVar4;
  undefined4 in_register_00000034;
  int res;
  sockaddr *saddr;
  Address *pAStack_18;
  int len;
  Address *addr_local;
  ServerSocket *this_local;
  
  pAStack_18 = (Address *)CONCAT44(in_register_00000034,__fd);
  addr_local = (Address *)this;
  __addr_00 = Socket::Address::getAddr(pAStack_18,(int *)((long)&saddr + 4));
  iVar3 = Socket::getFd(&this->super_Socket);
  iVar3 = ::bind(iVar3,(sockaddr *)__addr_00,saddr._4_4_);
  if (iVar3 == 0) {
    bVar1 = Socket::isSockStream(&this->super_Socket);
    if (!bVar1) {
      Socket::setConnected(&this->super_Socket,true,1);
    }
  }
  else {
    pcVar4 = Socket::Address::getName(pAStack_18);
    uVar2 = Socket::Address::getPort(pAStack_18);
    jh_log_print(3,"int JetHead::ServerSocket::bind(const Socket::Address &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x347,"Bind Failed on %s:%d",pcVar4,(uint)uVar2);
  }
  return iVar3;
}

Assistant:

int ServerSocket::bind( const Socket::Address &addr )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int len;
	const struct sockaddr *saddr = addr.getAddr( len );
	int res = ::bind( getFd(), saddr, len );

	// for UDP sockets set connected on bind, since listen will not be called.
	if ( res == 0 )
	{
		if ( isSockStream() == false )
			setConnected( true );
	}
	else
		LOG_WARN_PERROR( "Bind Failed on %s:%d", 
						 addr.getName(), addr.getPort() );
		
	LOG_INFO( "bind to %s on port %d", addr.getName(), addr.getPort() );
	
	return res;
}